

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::type_to_glsl_abi_cxx11_(CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint *puVar1;
  uint32_t uVar2;
  size_type sVar3;
  char *pcVar4;
  CompilerError *pCVar5;
  undefined4 in_register_00000014;
  allocator local_a1;
  char *local_a0;
  char *local_98;
  char *local_90;
  allocator local_81;
  char *local_80;
  char *local_78;
  char *local_70;
  allocator local_67;
  allocator local_66;
  allocator local_65;
  allocator local_64;
  allocator local_63;
  allocator local_62;
  allocator local_61;
  allocator local_60;
  allocator local_5f;
  allocator local_5e;
  allocator local_5d;
  allocator local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  allocator local_58;
  allocator local_57;
  allocator local_56;
  allocator local_55 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [36];
  key_type local_24;
  long lStack_20;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  lStack_20 = CONCAT44(in_register_00000014,id);
  type_local = type;
  this_local = this;
  switch(*(undefined4 *)(lStack_20 + 0x10)) {
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"void",&local_56);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_56);
    break;
  default:
    if ((*(int *)(lStack_20 + 0x18) == 1) && (*(int *)(lStack_20 + 0x1c) == 1)) {
      switch(*(undefined4 *)(lStack_20 + 0x10)) {
      case 2:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"bool",&local_57);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_57);
        break;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"???",&local_67);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_67);
        break;
      case 5:
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"min16int",&local_5e);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5e);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"int16_t",&local_5d);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5d);
        }
        break;
      case 6:
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"min16uint",&local_60);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_60);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"uint16_t",&local_5f);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5f);
        }
        break;
      case 7:
        pcVar4 = *(char **)(type[0x17].member_types.stack_storage.aligned_char + 0x18);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,pcVar4,&local_58);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_58);
        break;
      case 8:
        puVar1 = type[0x17].member_type_index_redirection.super_VectorView<unsigned_int>.ptr;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,(char *)puVar1,&local_59);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
        break;
      case 9:
        if (type[0x1c].vecsize < 0x3c) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"64-bit integers only supported in SM 6.0.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"int64_t",&local_63);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_63);
        break;
      case 10:
        if (type[0x1c].vecsize < 0x3c) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"64-bit integers only supported in SM 6.0.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"uint64_t",&local_64);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_64);
        break;
      case 0xb:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"atomic_uint",&local_5a);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5a);
        break;
      case 0xc:
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"min16float",&local_5c);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5c);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"half",&local_5b);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5b);
        }
        break;
      case 0xd:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"float",&local_61);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
        break;
      case 0xe:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"double",&local_62);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_62);
        break;
      case 0x13:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"RaytracingAccelerationStructure",&local_65);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_65);
        break;
      case 0x14:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"RayQuery<RAY_FLAG_NONE>",&local_66);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_66);
      }
    }
    else if ((*(uint *)(lStack_20 + 0x18) < 2) || (*(int *)(lStack_20 + 0x1c) != 1)) {
      switch(*(undefined4 *)(lStack_20 + 0x10)) {
      case 2:
        join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [5])"bool",(uint *)(lStack_20 + 0x1c),
                   (char (*) [2])0x41f771,(uint *)(lStack_20 + 0x18));
        break;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"???",&local_a1);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        break;
      case 5:
        local_98 = "min16int";
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) != 0) {
          local_98 = "int16_t";
        }
        join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  ((spirv_cross *)this,&local_98,(uint *)(lStack_20 + 0x1c),(char (*) [2])0x41f771,
                   (uint *)(lStack_20 + 0x18));
        break;
      case 6:
        local_a0 = "min16uint";
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) != 0) {
          local_a0 = "uint16_t";
        }
        join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  ((spirv_cross *)this,&local_a0,(uint *)(lStack_20 + 0x1c),(char (*) [2])0x41f771,
                   (uint *)(lStack_20 + 0x18));
        break;
      case 7:
        join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [4])0x40d3cf,(uint *)(lStack_20 + 0x1c),
                   (char (*) [2])0x41f771,(uint *)(lStack_20 + 0x18));
        break;
      case 8:
        join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [5])0x418df2,(uint *)(lStack_20 + 0x1c),
                   (char (*) [2])0x41f771,(uint *)(lStack_20 + 0x18));
        break;
      case 0xc:
        local_90 = "min16float";
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) != 0) {
          local_90 = "half";
        }
        join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  ((spirv_cross *)this,&local_90,(uint *)(lStack_20 + 0x1c),(char (*) [2])0x41f771,
                   (uint *)(lStack_20 + 0x18));
        break;
      case 0xd:
        join<char_const(&)[6],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [6])0x411346,(uint *)(lStack_20 + 0x1c),
                   (char (*) [2])0x41f771,(uint *)(lStack_20 + 0x18));
        break;
      case 0xe:
        join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [7])0x40ff90,(uint *)(lStack_20 + 0x1c),
                   (char (*) [2])0x41f771,(uint *)(lStack_20 + 0x18));
      }
    }
    else {
      switch(*(undefined4 *)(lStack_20 + 0x10)) {
      case 2:
        join<char_const(&)[5],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [5])"bool",(uint *)(lStack_20 + 0x18));
        break;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"???",&local_81);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
        break;
      case 5:
        local_78 = "min16int";
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) != 0) {
          local_78 = "int16_t";
        }
        join<char_const*,unsigned_int_const&>
                  ((spirv_cross *)this,&local_78,(uint *)(lStack_20 + 0x18));
        break;
      case 6:
        local_80 = "min16uint";
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) != 0) {
          local_80 = "uint16_t";
        }
        join<char_const*,unsigned_int_const&>
                  ((spirv_cross *)this,&local_80,(uint *)(lStack_20 + 0x18));
        break;
      case 7:
        join<char_const(&)[4],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [4])0x40d3cf,(uint *)(lStack_20 + 0x18));
        break;
      case 8:
        join<char_const(&)[5],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [5])0x418df2,(uint *)(lStack_20 + 0x18));
        break;
      case 9:
        join<char_const(&)[7],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [7])"i64vec",(uint *)(lStack_20 + 0x18));
        break;
      case 10:
        join<char_const(&)[7],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [7])"u64vec",(uint *)(lStack_20 + 0x18));
        break;
      case 0xc:
        local_70 = "min16float";
        if (((ulong)type[0x1c].array.super_VectorView<unsigned_int>.ptr & 0x100) != 0) {
          local_70 = "half";
        }
        join<char_const*,unsigned_int_const&>
                  ((spirv_cross *)this,&local_70,(uint *)(lStack_20 + 0x18));
        break;
      case 0xd:
        join<char_const(&)[6],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [6])0x411346,(uint *)(lStack_20 + 0x18));
        break;
      case 0xe:
        join<char_const(&)[7],unsigned_int_const&>
                  ((spirv_cross *)this,(char (*) [7])0x40ff90,(uint *)(lStack_20 + 0x18));
      }
    }
    break;
  case 0xf:
    if (((ulong)type[0x17].member_name_cache._M_h._M_before_begin._M_nxt & 0x100000000000000) == 0)
    {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(lStack_20 + 8));
      (*(type->super_IVariant)._vptr_IVariant[6])(this,type,(ulong)uVar2,1);
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(lStack_20 + 8));
      (*(type->super_IVariant)._vptr_IVariant[6])(local_48,type,(ulong)uVar2,1);
      join<char_const(&)[8],std::__cxx11::string>
                ((spirv_cross *)this,(char (*) [8])"struct ",local_48);
      ::std::__cxx11::string::~string((string *)local_48);
    }
    break;
  case 0x10:
  case 0x11:
    image_type_hlsl_abi_cxx11_(this,type,id);
    break;
  case 0x12:
    sVar3 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&type[8].super_IVariant.self,&local_24);
    pcVar4 = "SamplerState";
    if (sVar3 != 0) {
      pcVar4 = "SamplerComparisonState";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,pcVar4,local_55);
    ::std::allocator<char>::~allocator((allocator<char> *)local_55);
  }
  return this;
}

Assistant:

string CompilerHLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	// Ignore the pointer type since GLSL doesn't have pointers.

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_hlsl(type, id);

	case SPIRType::Sampler:
		return comparison_ids.count(id) ? "SamplerComparisonState" : "SamplerState";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			if (hlsl_options.enable_16bit_types)
				return "half";
			else
				return "min16float";
		case SPIRType::Short:
			if (hlsl_options.enable_16bit_types)
				return "int16_t";
			else
				return "min16int";
		case SPIRType::UShort:
			if (hlsl_options.enable_16bit_types)
				return "uint16_t";
			else
				return "min16uint";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "int64_t";
		case SPIRType::UInt64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "uint64_t";
		case SPIRType::AccelerationStructure:
			return "RaytracingAccelerationStructure";
		case SPIRType::RayQuery:
			return "RayQuery<RAY_FLAG_NONE>";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.vecsize);
		case SPIRType::Int:
			return join("int", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.vecsize);
		case SPIRType::Float:
			return join("float", type.vecsize);
		case SPIRType::Double:
			return join("double", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("int", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.columns, "x", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.columns, "x", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("float", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("double", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}